

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyTextureDataExtended
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,bool shaderOnly)

{
  int iVar1;
  GLint GVar2;
  pointer out_data;
  pointer __s;
  pointer puVar3;
  pointer pbVar4;
  GLenum GVar5;
  ostream *poVar6;
  TestError *this_00;
  int iVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  GLint y_2;
  size_type sVar9;
  GLint GVar10;
  deUint32 dVar11;
  SparseTexture2CommitmentTestCase *this_01;
  long lVar12;
  TokenStrings *this_02;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  GLint z;
  GLint y_1;
  GLint width;
  GLint depth;
  GLint height;
  TransferFormat local_410;
  GLint local_408;
  GLuint verifyTexture;
  size_type local_400;
  UncommittedRegionsAccessTestCase *local_3f8;
  int local_3ec;
  ulong local_3e8;
  ulong local_3e0;
  pointer local_3d8;
  ostream *local_3d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string local_378;
  string local_358;
  string shader;
  ProgramSources sources;
  TokenStrings s;
  ShaderProgram program;
  bool bVar18;
  
  local_3e8 = CONCAT44(in_register_0000000c,format);
  local_3d0 = (ostream *)
              &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               field_0x88;
  poVar6 = std::operator<<(local_3d0,"Verify Texture [level: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,level);
  std::operator<<(poVar6,"] - ");
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x676);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_410 = glu::getTransferFormat
                        ((this->super_SparseTexture2CommitmentTestCase).
                         super_SparseTextureCommitmentTestCase.mState.format);
  local_400 = CONCAT44(local_400._4_4_,target);
  local_408 = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar10 = depth;
  lVar12 = (long)width;
  if (height == 0 || width + 1U < 3) {
    return true;
  }
  if (depth < (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mState.minDepth) {
    return true;
  }
  iVar7 = (int)(lVar12 / 2);
  if (shaderOnly) {
    dVar11 = 0x8c1a;
    if ((GLenum)local_400 == 0x9100) {
      dVar11 = 0xde1;
    }
    local_410.format = dVar11;
    if ((GLenum)local_400 == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar9 = (size_type)(height * width * depth);
    local_3f8 = this;
    local_3ec = iVar7;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar9);
    puVar3 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,sVar9);
    gl4cts::Texture::Generate(gl,&verifyTexture);
    gl4cts::Texture::Bind(gl,verifyTexture,local_410.format);
    gl4cts::Texture::Storage(gl,local_410.format,1,0x8229,width,height,depth);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x6f6);
    bVar18 = true;
    bVar17 = true;
    iVar7 = 0;
    while (iVar7 < (local_3f8->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.mState.samples) {
      local_3e0 = CONCAT44(local_3e0._4_4_,iVar7);
      memset(__s,0,sVar9);
      gl4cts::Texture::Bind(gl,verifyTexture,local_410.format);
      gl4cts::Texture::SubImage(gl,local_410.format,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"Texture::SubImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x6ff);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shader,st2_compute_textureVerify,(allocator<char> *)&s);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"image",(allocator<char> *)&sources);
      this_01 = (SparseTexture2CommitmentTestCase *)0x17f30d4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"image",(allocator<char> *)&program);
      SparseTexture2CommitmentTestCase::createShaderTokens
                (&s,this_01,(GLenum)local_400,(GLint)local_3e8,(GLint)local_3e0,&local_358,
                 &local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_358);
      replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
      replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
      replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
      replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
      replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
      replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
      replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
      replaceToken("<RESULT_EXPECTED>",s.resultDefault._M_dataplus._M_p,&shader);
      replaceToken("<EPSILON>",s.epsilon._M_dataplus._M_p,&shader);
      memset(&sources,0,0xac);
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      sources._193_8_ = 0;
      glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
      glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
      std::__cxx11::string::~string
                ((string *)
                 &program.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      glu::ShaderProgram::ShaderProgram
                (&program,((local_3f8->super_SparseTexture2CommitmentTestCase).
                           super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                          m_renderCtx,&sources);
      if (program.m_program.m_info.linkOk == true) {
        (*gl->useProgram)(program.m_program.m_program);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glUseProgram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x718);
        (*gl->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x71f);
        (*gl->bindImageTexture)(1,*texture,local_408,'\0',0,35000,(GLenum)local_3e8);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x726);
        (*gl->uniform1i)(1,0);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x728);
        (*gl->uniform1i)(2,1);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x72a);
        (*gl->dispatchCompute)(width,height,depth);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x72c);
        (*gl->memoryBarrier)(0xffffffff);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glMemoryBarrier",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x72e);
        gl4cts::Texture::GetData(gl,0,local_410.format,0x1903,0x1401,__s);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x731);
        uVar8 = (ulong)(uint)depth;
        if (depth < 1) {
          uVar8 = 0;
        }
        iVar7 = 0;
        if (0 < height) {
          iVar7 = height;
        }
        for (iVar15 = local_3ec; iVar15 < width; iVar15 = iVar15 + 1) {
          local_3d8 = (pointer)CONCAT44(local_3d8._4_4_,iVar15);
          iVar14 = iVar15;
          for (iVar13 = 0; uVar16 = uVar8, iVar1 = iVar14, iVar13 != iVar7; iVar13 = iVar13 + 1) {
            while (uVar16 != 0) {
              bVar17 = bVar18;
              if (puVar3[iVar1] != __s[iVar1]) {
                bVar17 = false;
              }
              uVar16 = uVar16 - 1;
              bVar18 = bVar17;
              iVar1 = iVar1 + height * width;
            }
            iVar14 = iVar14 + width;
          }
        }
      }
      else {
        poVar6 = std::operator<<(local_3d0,
                                 "Compute shader compilation failed (reading) for target: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(GLenum)local_400);
        poVar6 = std::operator<<(poVar6,", format: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_3e8);
        poVar6 = std::operator<<(poVar6,", sample: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(GLint)local_3e0);
        poVar6 = std::operator<<(poVar6,", infoLog: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        &((*program.m_shaders[5].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog);
        poVar6 = std::operator<<(poVar6,", shaderSource: ");
        poVar6 = std::operator<<(poVar6,shader._M_dataplus._M_p);
        std::operator<<(poVar6," - ");
        bVar18 = false;
        bVar17 = false;
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      glu::ProgramSources::~ProgramSources(&sources);
      SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
      std::__cxx11::string::~string((string *)&shader);
      iVar7 = (GLint)local_3e0 + 1;
    }
    gl4cts::Texture::Delete(gl,&verifyTexture);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    this_02 = (TokenStrings *)&vecExpData;
  }
  else {
    local_3f8 = (UncommittedRegionsAccessTestCase *)
                &(this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.mState.format;
    local_3e8 = (ulong)local_410 >> 0x20;
    if ((GLenum)local_400 == 0x8513) {
      s.format.field_2._M_allocated_capacity = 0;
      s.format._M_dataplus._M_p = (pointer)0x0;
      s.format._M_string_length = 0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8515);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8516);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8517);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8518);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8519);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x851a);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      GVar2 = height;
      GVar10 = width;
      iVar15 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3f8);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar9 = (size_type)(GVar2 * GVar10 * iVar15);
      local_3ec = iVar7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&program,sVar9);
      pbVar4 = sources.sources[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3d8 = program.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_400 = sVar9;
      memset(sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0xff,sVar9);
      bVar17 = true;
      uVar8 = 0;
      do {
        GVar10 = local_408;
        if ((ulong)((long)(s.format._M_string_length - (long)s.format._M_dataplus._M_p) >> 2) <=
            uVar8) break;
        GVar5 = *(GLenum *)(s.format._M_dataplus._M_p + uVar8 * 4);
        local_3e0 = uVar8;
        poVar6 = std::operator<<(local_3d0,"Verify Subtarget [subtarget: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,GVar5);
        std::operator<<(poVar6,"] - ");
        out_data = local_3d8;
        memset(local_3d8,0xff,local_400);
        gl4cts::Texture::GetData(gl,GVar10,GVar5,local_410.format,(GLenum)local_3e8,out_data);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x6c7);
        GVar10 = width;
        for (iVar7 = local_3ec; iVar7 < GVar10; iVar7 = iVar7 + 1) {
          for (iVar15 = 0; iVar15 < height; iVar15 = iVar15 + 1) {
            for (iVar14 = 0; iVar14 < depth; iVar14 = iVar14 + 1) {
              iVar13 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3f8);
              GVar10 = width;
              lVar12 = (long)((width * iVar15 + iVar7) * iVar13);
              iVar13 = bcmp((void *)((long)&(pbVar4->_M_dataplus)._M_p + lVar12),
                            (void *)(lVar12 + (long)local_3d8),(long)iVar13);
              if (iVar13 != 0) {
                bVar17 = false;
              }
            }
          }
        }
        uVar8 = local_3e0 + 1;
      } while (bVar17 != false);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&program);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sources);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&s);
      return bVar17;
    }
    if ((GLenum)local_400 == 0x9100) {
      return true;
    }
    if ((GLenum)local_400 == 0x9102) {
      return true;
    }
    iVar15 = height * width;
    iVar7 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3f8);
    s.format._M_dataplus._M_p = (pointer)0x0;
    s.format._M_string_length = 0;
    s.format.field_2._M_allocated_capacity = 0;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar9 = (size_type)(GVar10 * iVar7 * iVar15);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,sVar9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar9);
    pbVar4 = sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3d8 = (pointer)s.format._M_dataplus._M_p;
    memset(s.format._M_dataplus._M_p,0,sVar9);
    memset(pbVar4,0xff,sVar9);
    gl4cts::Texture::GetData
              (gl,local_408,(GLenum)local_400,local_410.format,(GLenum)local_3e8,pbVar4);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"Texture::GetData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x699);
    bVar17 = true;
    uVar8 = lVar12 / 2 & 0xffffffff;
    GVar10 = width;
    while (iVar7 = (int)uVar8, iVar7 < GVar10) {
      for (iVar15 = 0; iVar15 < height; iVar15 = iVar15 + 1) {
        for (iVar14 = 0; iVar14 < depth; iVar14 = iVar14 + 1) {
          iVar13 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3f8);
          GVar10 = width;
          lVar12 = (long)((width * iVar15 + iVar7) * iVar13);
          iVar13 = bcmp((pointer)((long)local_3d8 + lVar12),
                        (void *)((long)&(pbVar4->_M_dataplus)._M_p + lVar12),(long)iVar13);
          if (iVar13 != 0) {
            bVar17 = false;
          }
        }
      }
      uVar8 = (ulong)(iVar7 + 1);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sources);
    this_02 = &s;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  return bVar17;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyTextureDataExtended(const Functions& gl, GLint target, GLint format,
																 GLuint& texture, GLint level, bool shaderOnly)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Verify texture using API glGetTexImage* (Skip multisample textures as it can not be verified using API)
	if (!shaderOnly && target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
		deMemset(exp_data, 0, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = widthCommitted; x < width; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	// Verify texture using API glGetTexImage* (Only cube map as it has to be verified for subtargets)
	else if (!shaderOnly && target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = widthCommitted; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// Verify texture using shader imageLoad function
	else if (shaderOnly)
	{
		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 255 because shader fills output texture with 255 if in texture is filled with zeros
		deMemset(exp_data, 255, texSize);

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultDefault.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = widthCommitted; x < width; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}